

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O0

bool __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::dynamic_object_typename_match
          (Dynamic_Object_Function *this,Boxed_Value *bv,string *name,
          unique_ptr<chaiscript::Type_Info,_std::default_delete<chaiscript::Type_Info>_> *ti,
          Type_Conversions_State *t_conversions)

{
  bool bVar1;
  Type_Info *pTVar2;
  Dynamic_Object *this_00;
  string *__lhs;
  type ti_00;
  __type_conflict2 local_6a;
  bad_cast *anon_var_0;
  Dynamic_Object *d;
  Type_Conversions_State *t_conversions_local;
  unique_ptr<chaiscript::Type_Info,_std::default_delete<chaiscript::Type_Info>_> *ti_local;
  string *name_local;
  Boxed_Value *bv_local;
  Dynamic_Object_Function *this_local;
  
  pTVar2 = Boxed_Value::get_type_info(bv);
  bVar1 = Type_Info::bare_equal(pTVar2,&this->m_doti);
  if (bVar1) {
    this_00 = boxed_cast<chaiscript::dispatch::Dynamic_Object_const&>(bv,t_conversions);
    bVar1 = std::operator==(name,"Dynamic_Object");
    local_6a = true;
    if (!bVar1) {
      __lhs = Dynamic_Object::get_type_name_abi_cxx11_(this_00);
      local_6a = std::operator==(__lhs,name);
    }
    this_local._7_1_ = local_6a;
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)ti);
    if (bVar1) {
      pTVar2 = Boxed_Value::get_type_info(bv);
      ti_00 = Catch::clara::std::
              unique_ptr<chaiscript::Type_Info,_std::default_delete<chaiscript::Type_Info>_>::
              operator*(ti);
      this_local._7_1_ = Type_Info::bare_equal(pTVar2,ti_00);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool dynamic_object_typename_match(const Boxed_Value &bv,
                                           const std::string &name,
                                           const std::unique_ptr<Type_Info> &ti,
                                           const Type_Conversions_State &t_conversions) const noexcept {
          if (bv.get_type_info().bare_equal(m_doti)) {
            try {
              const Dynamic_Object &d = boxed_cast<const Dynamic_Object &>(bv, &t_conversions);
              return name == "Dynamic_Object" || d.get_type_name() == name;
            } catch (const std::bad_cast &) {
              return false;
            }
          } else {
            if (ti) {
              return bv.get_type_info().bare_equal(*ti);
            } else {
              return false;
            }
          }
        }